

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5ExprNode * fts5ParsePhraseToAnd(Fts5Parse *pParse,Fts5ExprNearset *pNear)

{
  int iVar1;
  int iVar2;
  Fts5ExprNode *pNode;
  Fts5ExprPhrase *pPhrase_00;
  char *pcVar3;
  Fts5ExprNode *pFVar4;
  Fts5Parse *in_RSI;
  Fts5Parse *in_RDI;
  Fts5ExprTerm *pTo;
  Fts5ExprTerm *p;
  Fts5ExprPhrase *pPhrase;
  Fts5ExprNode *pRet;
  int nByte;
  int ii;
  int nTerm;
  Fts5Parse *in_stack_ffffffffffffffb8;
  Fts5ExprNode *in_stack_ffffffffffffffc0;
  Fts5Parse *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  int iVar6;
  
  iVar6 = *(int *)(in_RSI->apPhrase + 3);
  iVar1 = iVar6 * 8 + 0x38;
  pNode = (Fts5ExprNode *)
          sqlite3Fts5MallocZero
                    (&in_stack_ffffffffffffffc0->eType,(sqlite3_int64)in_stack_ffffffffffffffb8);
  if (pNode != (Fts5ExprNode *)0x0) {
    pNode->eType = 2;
    pNode->nChild = iVar6;
    pNode->iHeight = 1;
    fts5ExprAssignXNext(pNode);
    in_RDI->nPhrase = in_RDI->nPhrase + -1;
    for (iVar5 = 0; iVar5 < iVar6; iVar5 = iVar5 + 1) {
      pPhrase_00 = (Fts5ExprPhrase *)
                   sqlite3Fts5MallocZero
                             (&in_stack_ffffffffffffffc0->eType,
                              (sqlite3_int64)in_stack_ffffffffffffffb8);
      if (pPhrase_00 != (Fts5ExprPhrase *)0x0) {
        iVar2 = parseGrowPhraseArray(in_stack_ffffffffffffffc8);
        if (iVar2 == 0) {
          in_stack_ffffffffffffffc8 = (Fts5Parse *)(in_RSI->apPhrase + (long)iVar5 * 5 + 4);
          in_stack_ffffffffffffffc0 = (Fts5ExprNode *)pPhrase_00->aTerm;
          iVar2 = in_RDI->nPhrase;
          in_RDI->nPhrase = iVar2 + 1;
          in_RDI->apPhrase[iVar2] = pPhrase_00;
          pPhrase_00->nTerm = 1;
          in_stack_ffffffffffffffb8 = in_RDI;
          pcVar3 = sqlite3Fts5Strndup((int *)pPhrase_00,(char *)in_stack_ffffffffffffffc8,
                                      (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
          *(char **)&in_stack_ffffffffffffffc0->bNomatch = pcVar3;
          *(int *)&in_stack_ffffffffffffffc0->xNext = in_stack_ffffffffffffffc8->rc;
          *(int *)((long)&in_stack_ffffffffffffffc0->xNext + 4) = in_stack_ffffffffffffffc8->nPhrase
          ;
          in_RDI = in_stack_ffffffffffffffb8;
          sqlite3Fts5ParseNearset
                    (in_RSI,(Fts5ExprNearset *)CONCAT44(iVar6,iVar5),
                     (Fts5ExprPhrase *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
          pFVar4 = sqlite3Fts5ParseNode
                             (in_RDI,(int)((ulong)in_RSI >> 0x20),
                              (Fts5ExprNode *)CONCAT44(iVar6,iVar5),
                              (Fts5ExprNode *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                              (Fts5ExprNearset *)pNode);
          pNode->apChild[iVar5] = pFVar4;
        }
        else {
          fts5ExprPhraseFree(pPhrase_00);
        }
      }
    }
    if (in_RDI->rc == 0) {
      sqlite3Fts5ParseNearsetFree((Fts5ExprNearset *)in_stack_ffffffffffffffc0);
    }
    else {
      sqlite3Fts5ParseNodeFree(in_stack_ffffffffffffffc0);
      pNode = (Fts5ExprNode *)0x0;
    }
  }
  return pNode;
}

Assistant:

static Fts5ExprNode *fts5ParsePhraseToAnd(
  Fts5Parse *pParse,
  Fts5ExprNearset *pNear
){
  int nTerm = pNear->apPhrase[0]->nTerm;
  int ii;
  int nByte;
  Fts5ExprNode *pRet;

  assert( pNear->nPhrase==1 );
  assert( pParse->bPhraseToAnd );

  nByte = sizeof(Fts5ExprNode) + nTerm*sizeof(Fts5ExprNode*);
  pRet = (Fts5ExprNode*)sqlite3Fts5MallocZero(&pParse->rc, nByte);
  if( pRet ){
    pRet->eType = FTS5_AND;
    pRet->nChild = nTerm;
    pRet->iHeight = 1;
    fts5ExprAssignXNext(pRet);
    pParse->nPhrase--;
    for(ii=0; ii<nTerm; ii++){
      Fts5ExprPhrase *pPhrase = (Fts5ExprPhrase*)sqlite3Fts5MallocZero(
          &pParse->rc, sizeof(Fts5ExprPhrase)
      );
      if( pPhrase ){
        if( parseGrowPhraseArray(pParse) ){
          fts5ExprPhraseFree(pPhrase);
        }else{
          Fts5ExprTerm *p = &pNear->apPhrase[0]->aTerm[ii];
          Fts5ExprTerm *pTo = &pPhrase->aTerm[0];
          pParse->apPhrase[pParse->nPhrase++] = pPhrase;
          pPhrase->nTerm = 1;
          pTo->pTerm = sqlite3Fts5Strndup(&pParse->rc, p->pTerm, p->nFullTerm);
          pTo->nQueryTerm = p->nQueryTerm;
          pTo->nFullTerm = p->nFullTerm;
          pRet->apChild[ii] = sqlite3Fts5ParseNode(pParse, FTS5_STRING,
              0, 0, sqlite3Fts5ParseNearset(pParse, 0, pPhrase)
          );
        }
      }
    }

    if( pParse->rc ){
      sqlite3Fts5ParseNodeFree(pRet);
      pRet = 0;
    }else{
      sqlite3Fts5ParseNearsetFree(pNear);
    }
  }

  return pRet;
}